

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::FeedbackRecordVariableSelectionCase::init
          (FeedbackRecordVariableSelectionCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  ContextInfo *pCVar4;
  NotSupportedError *this_00;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  undefined4 extraout_var_00;
  ShaderProgram *this_01;
  ProgramSources *pPVar7;
  undefined7 extraout_var;
  TestError *this_02;
  allocator<char> local_609;
  string local_608;
  undefined1 local_5e2;
  allocator<char> local_5e1;
  string local_5e0;
  TransformFeedbackVarying local_5c0;
  TransformFeedbackMode local_59c;
  string local_598;
  ShaderSource local_578;
  string local_550;
  ShaderSource local_530;
  string local_508;
  ShaderSource local_4e8;
  string local_4c0;
  ShaderSource local_4a0;
  string local_478;
  ShaderSource local_458;
  ProgramSources local_430;
  MessageBuilder local_360;
  long local_1e0;
  Functions *gl;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  deUint32 local_1c;
  ContextType local_18;
  undefined1 local_11;
  FeedbackRecordVariableSelectionCase *pFStack_10;
  bool supportsES32;
  FeedbackRecordVariableSelectionCase *this_local;
  
  pFStack_10 = this;
  pRVar3 = Context::getRenderContext((this->super_TestCase).m_context);
  local_18.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_1c = (deUint32)glu::ApiType::es(3,2);
  local_11 = glu::contextSupports(local_18,(ApiType)local_1c);
  if ((bool)local_11) {
LAB_008e722f:
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&gl,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&gl,
                        (char (*) [143])
                        "Declaring multiple output variables with the same name in multiple shader stages. Capturing the value of the varying using transform feedback."
                       );
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&gl);
    if (((anonymous_namespace)::FeedbackRecordVariableSelectionCase::init()::initialData == '\0') &&
       (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::FeedbackRecordVariableSelectionCase::
                                     init()::initialData), iVar2 != 0)) {
      tcu::Vector<float,_4>::Vector(init::initialData,-1.0,-1.0,-1.0,-1.0);
      tcu::Vector<float,_4>::Vector(init::initialData + 1,-1.0,-1.0,-1.0,-1.0);
      tcu::Vector<float,_4>::Vector(init::initialData + 2,-1.0,-1.0,-1.0,-1.0);
      __cxa_guard_release(&(anonymous_namespace)::FeedbackRecordVariableSelectionCase::init()::
                           initialData);
    }
    pRVar3 = Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    local_1e0 = CONCAT44(extraout_var_00,iVar2);
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_360,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_360,
                        (char (*) [95])
                        "Creating buffer for transform feedback. Allocating storage for one triangle. Filling with -1.0"
                       );
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_360);
    (**(code **)(local_1e0 + 0x6c8))(1,&this->m_xfbBuf);
    (**(code **)(local_1e0 + 0x40))(0x8c8e,this->m_xfbBuf);
    (**(code **)(local_1e0 + 0x150))(0x8c8e,0x30,init::initialData,0x88e9);
    err = (**(code **)(local_1e0 + 0x800))();
    glu::checkError(err,"gen xfb buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0xb2f);
    this_01 = (ShaderProgram *)operator_new(0xd0);
    local_5e2 = 1;
    pRVar3 = Context::getRenderContext((this->super_TestCase).m_context);
    glu::ProgramSources::ProgramSources(&local_430);
    (anonymous_namespace)::FeedbackRecordVariableSelectionCase::getVertexSource_abi_cxx11_
              (&local_478,this);
    glu::VertexSource::VertexSource((VertexSource *)&local_458,&local_478);
    pPVar7 = glu::ProgramSources::operator<<(&local_430,&local_458);
    (anonymous_namespace)::FeedbackRecordVariableSelectionCase::getFragmentSource_abi_cxx11_
              (&local_4c0,this);
    glu::FragmentSource::FragmentSource((FragmentSource *)&local_4a0,&local_4c0);
    pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_4a0);
    (anonymous_namespace)::FeedbackRecordVariableSelectionCase::
    getTessellationControlSource_abi_cxx11_(&local_508,this);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)&local_4e8,&local_508);
    pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_4e8);
    (anonymous_namespace)::FeedbackRecordVariableSelectionCase::
    getTessellationEvaluationSource_abi_cxx11_(&local_550,this);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_530,&local_550);
    pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_530);
    (anonymous_namespace)::FeedbackRecordVariableSelectionCase::getGeometrySource_abi_cxx11_
              (&local_598,this);
    glu::GeometrySource::GeometrySource((GeometrySource *)&local_578,&local_598);
    pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_578);
    glu::TransformFeedbackMode::TransformFeedbackMode(&local_59c,0x8c8c);
    pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_59c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5e0,"tf_feedback",&local_5e1);
    glu::TransformFeedbackVarying::TransformFeedbackVarying(&local_5c0,&local_5e0);
    pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_5c0);
    glu::ShaderProgram::ShaderProgram(this_01,pRVar3,pPVar7);
    local_5e2 = 0;
    this->m_program = this_01;
    glu::TransformFeedbackVarying::~TransformFeedbackVarying(&local_5c0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::allocator<char>::~allocator(&local_5e1);
    glu::GeometrySource::~GeometrySource((GeometrySource *)&local_578);
    std::__cxx11::string::~string((string *)&local_598);
    glu::TessellationEvaluationSource::~TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_530);
    std::__cxx11::string::~string((string *)&local_550);
    glu::TessellationControlSource::~TessellationControlSource
              ((TessellationControlSource *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_508);
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_4c0);
    glu::VertexSource::~VertexSource((VertexSource *)&local_458);
    std::__cxx11::string::~string((string *)&local_478);
    glu::ProgramSources::~ProgramSources(&local_430);
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    glu::operator<<(pTVar5,this->m_program);
    bVar1 = glu::ShaderProgram::isOk(this->m_program);
    if (bVar1) {
      return (int)CONCAT71(extraout_var,bVar1);
    }
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_608,"could not build program",&local_609);
    tcu::TestError::TestError(this_02,&local_608);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pCVar4 = Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_EXT_tessellation_shader");
  if (bVar1) {
    pCVar4 = Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_EXT_geometry_shader");
    if (bVar1) goto LAB_008e722f;
  }
  local_55 = 1;
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "Test requires GL_EXT_tessellation_shader and GL_EXT_geometry_shader extensions",
             &local_41);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
  local_55 = 0;
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void FeedbackRecordVariableSelectionCase::init (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 &&
		(!m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader") ||
		 !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader")))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader and GL_EXT_geometry_shader extensions");

	m_testCtx.getLog() << tcu::TestLog::Message << "Declaring multiple output variables with the same name in multiple shader stages. Capturing the value of the varying using transform feedback." << tcu::TestLog::EndMessage;

	// gen feedback buffer fit for 1 triangle (4 components)
	{
		static const tcu::Vec4 initialData[3] =
		{
			tcu::Vec4(-1.0f, -1.0f, -1.0f, -1.0f),
			tcu::Vec4(-1.0f, -1.0f, -1.0f, -1.0f),
			tcu::Vec4(-1.0f, -1.0f, -1.0f, -1.0f),
		};

		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		m_testCtx.getLog() << tcu::TestLog::Message << "Creating buffer for transform feedback. Allocating storage for one triangle. Filling with -1.0" << tcu::TestLog::EndMessage;

		gl.genBuffers(1, &m_xfbBuf);
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_xfbBuf);
		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, (int)(sizeof(tcu::Vec4[3])), initialData, GL_DYNAMIC_READ);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen xfb buf");
	}

	// gen shader
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
																	 << glu::VertexSource(getVertexSource())
																	 << glu::FragmentSource(getFragmentSource())
																	 << glu::TessellationControlSource(getTessellationControlSource())
																	 << glu::TessellationEvaluationSource(getTessellationEvaluationSource())
																	 << glu::GeometrySource(getGeometrySource())
																	 << glu::TransformFeedbackMode(GL_INTERLEAVED_ATTRIBS)
																	 << glu::TransformFeedbackVarying("tf_feedback"));
	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
		throw tcu::TestError("could not build program");
}